

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocketaddress.c
# Opt level: O3

PSocketAddress * p_socket_address_new_from_native(pconstpointer native,psize len)

{
  undefined8 uVar1;
  PSocketAddress *mem;
  char *pcVar2;
  
  if (native == (pconstpointer)0x0) {
    return (PSocketAddress *)0x0;
  }
  if (len == 0) {
    return (PSocketAddress *)0x0;
  }
  mem = (PSocketAddress *)p_malloc0(0x20);
  if (mem == (PSocketAddress *)0x0) {
    return (PSocketAddress *)0x0;
  }
  if (*native == 10) {
    if (0x1b < len) {
      uVar1 = *(undefined8 *)((long)native + 0x10);
      *(undefined8 *)&mem->addr = *(undefined8 *)((long)native + 8);
      *(undefined8 *)((long)&mem->addr + 8) = uVar1;
      mem->family = P_SOCKET_FAMILY_INET6;
      mem->port = *(ushort *)((long)native + 2) << 8 | *(ushort *)((long)native + 2) >> 8;
      mem->flowinfo = *(puint32 *)((long)native + 4);
      mem->scope_id = *(puint32 *)((long)native + 0x18);
      return mem;
    }
    pcVar2 = "PSocketAddress::p_socket_address_new_from_native: invalid IPv6 native size";
  }
  else {
    if (*native != 2) goto LAB_00109b03;
    if (0xf < len) {
      (mem->addr).sin_addr.s_addr = *(in_addr_t *)((long)native + 4);
      mem->family = P_SOCKET_FAMILY_INET;
      mem->port = *(ushort *)((long)native + 2) << 8 | *(ushort *)((long)native + 2) >> 8;
      return mem;
    }
    pcVar2 = "PSocketAddress::p_socket_address_new_from_native: invalid IPv4 native size";
  }
  printf("** Warning: %s **\n",pcVar2);
LAB_00109b03:
  p_free(mem);
  return (PSocketAddress *)0x0;
}

Assistant:

P_LIB_API PSocketAddress *
p_socket_address_new_from_native (pconstpointer	native,
				  psize		len)
{
	PSocketAddress	*ret;
	puint16		family;

	if (P_UNLIKELY (native == NULL || len == 0))
		return NULL;

	if (P_UNLIKELY ((ret = p_malloc0 (sizeof (PSocketAddress))) == NULL))
		return NULL;

	family = ((const struct sockaddr *) native)->sa_family;

	if (family == AF_INET) {
		if (len < sizeof (struct sockaddr_in)) {
			P_WARNING ("PSocketAddress::p_socket_address_new_from_native: invalid IPv4 native size");
			p_free (ret);
			return NULL;
		}

		memcpy (&ret->addr.sin_addr, &((const struct sockaddr_in *) native)->sin_addr, sizeof (struct in_addr));
		ret->family = P_SOCKET_FAMILY_INET;
		ret->port   = p_ntohs (((struct sockaddr_in *) native)->sin_port);
		return ret;
	}
#ifdef AF_INET6
	else if (family == AF_INET6) {
		if (len < sizeof (struct sockaddr_in6)) {
			P_WARNING ("PSocketAddress::p_socket_address_new_from_native: invalid IPv6 native size");
			p_free (ret);
			return NULL;
		}

		memcpy (&ret->addr.sin6_addr,
			&((struct sockaddr_in6 *) native)->sin6_addr,
			sizeof (struct in6_addr));

		ret->family   = P_SOCKET_FAMILY_INET6;
		ret->port     = p_ntohs (((struct sockaddr_in *) native)->sin_port);
#ifdef PLIBSYS_SOCKADDR_IN6_HAS_FLOWINFO
		ret->flowinfo = ((struct sockaddr_in6 *) native)->sin6_flowinfo;
#endif
#ifdef PLIBSYS_SOCKADDR_IN6_HAS_SCOPEID
		ret->scope_id = ((struct sockaddr_in6 *) native)->sin6_scope_id;
#endif
		return ret;
	}
#endif
	else {
		p_free (ret);
		return NULL;
	}
}